

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O0

void check_sockname(sockaddr *addr,char *compare_ip,int compare_port,char *context)

{
  uint16_t uVar1;
  int iVar2;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  char local_68 [4];
  int r;
  char check_ip [17];
  short local_4e;
  undefined1 auStack_4c [4];
  sockaddr_in compare_addr;
  sockaddr_in check_addr;
  char *context_local;
  int compare_port_local;
  char *compare_ip_local;
  sockaddr *addr_local;
  
  compare_addr.sin_zero = *(uchar (*) [8])addr;
  iVar2 = uv_ip4_addr(compare_ip,compare_port,(sockaddr_in *)(check_ip + 0x10));
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getsockname.c"
            ,0x57,"uv_ip4_addr(compare_ip, compare_port, &compare_addr)","==","0",(long)iVar2,"==",0
           );
    abort();
  }
  if (((ulong)compare_addr.sin_zero & 0xffff) != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getsockname.c"
            ,0x5a,"check_addr.sin_family","==","2",(ulong)compare_addr.sin_zero & 0xffff,"==",2);
    abort();
  }
  if ((ulong)stack0xffffffffffffffb0 != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getsockname.c"
            ,0x5b,"compare_addr.sin_family","==","2",(ulong)stack0xffffffffffffffb0,"==",2);
    abort();
  }
  iVar2 = memcmp(compare_addr.sin_zero + 4,auStack_4c,4);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getsockname.c"
            ,0x60,
            "memcmp(&check_addr.sin_addr, &compare_addr.sin_addr, sizeof compare_addr.sin_addr)",
            "==","0",(long)iVar2,"==",0);
    abort();
  }
  if ((compare_port != 0) && (compare_addr.sin_zero._2_2_ != local_4e)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getsockname.c"
            ,99,"compare_port == 0 || check_addr.sin_port == compare_addr.sin_port");
    abort();
  }
  iVar2 = uv_ip4_name((sockaddr_in *)compare_addr.sin_zero,local_68,0x11);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getsockname.c"
            ,0x66,"r","==","0",(long)iVar2,"==",0);
    abort();
  }
  uVar1 = ntohs(compare_addr.sin_zero._2_2_);
  printf("%s: %s:%d\n",context,local_68,(ulong)uVar1);
  return;
}

Assistant:

static void check_sockname(struct sockaddr* addr, const char* compare_ip,
  int compare_port, const char* context) {
  struct sockaddr_in check_addr = *(struct sockaddr_in*) addr;
  struct sockaddr_in compare_addr;
  char check_ip[17];
  int r;

  ASSERT_OK(uv_ip4_addr(compare_ip, compare_port, &compare_addr));

  /* Both addresses should be ipv4 */
  ASSERT_EQ(check_addr.sin_family, AF_INET);
  ASSERT_EQ(compare_addr.sin_family, AF_INET);

  /* Check if the ip matches */
  ASSERT_OK(memcmp(&check_addr.sin_addr,
            &compare_addr.sin_addr,
            sizeof compare_addr.sin_addr));

  /* Check if the port matches. If port == 0 anything goes. */
  ASSERT(compare_port == 0 || check_addr.sin_port == compare_addr.sin_port);

  r = uv_ip4_name(&check_addr, (char*) check_ip, sizeof check_ip);
  ASSERT_OK(r);

  printf("%s: %s:%d\n", context, check_ip, ntohs(check_addr.sin_port));
}